

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

void CameraMoveForward(Camera *camera,float distance,_Bool moveInWorldPlane)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar1 = (camera->position).x;
  uVar5 = (camera->position).y;
  uVar2 = (camera->target).x;
  uVar6 = (camera->target).y;
  fVar11 = (float)uVar2 - (float)uVar1;
  fVar12 = (float)uVar6 - (float)uVar5;
  fVar10 = (camera->target).z - (camera->position).z;
  fVar9 = fVar10 * fVar10 + fVar11 * fVar11 + fVar12 * fVar12;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    fVar9 = 1.0 / fVar9;
    fVar11 = fVar11 * fVar9;
    fVar12 = fVar12 * fVar9;
    fVar10 = fVar10 * fVar9;
  }
  if (moveInWorldPlane) {
    fVar9 = fVar10 * fVar10 + fVar11 * fVar11 + 0.0;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      fVar9 = 1.0 / fVar9;
      fVar11 = fVar11 * fVar9;
      fVar12 = fVar9 * 0.0;
      fVar10 = fVar10 * fVar9;
    }
    else {
      fVar12 = 0.0;
    }
  }
  uVar3 = (camera->position).x;
  uVar7 = (camera->position).y;
  uVar4 = (camera->target).x;
  uVar8 = (camera->target).y;
  (camera->position).x = fVar11 * distance + (float)uVar3;
  (camera->position).y = (float)uVar7 + fVar12 * distance;
  (camera->position).z = (camera->position).z + fVar10 * distance;
  (camera->target).x = fVar11 * distance + (float)uVar4;
  (camera->target).y = (float)uVar8 + fVar12 * distance;
  (camera->target).z = fVar10 * distance + (camera->target).z;
  return;
}

Assistant:

void CameraMoveForward(Camera *camera, float distance, bool moveInWorldPlane)
{
    Vector3 forward = GetCameraForward(camera);

    if (moveInWorldPlane)
    {
        // Project vector onto world plane
        forward.y = 0;
        forward = Vector3Normalize(forward);
    }

    // Scale by distance
    forward = Vector3Scale(forward, distance);

    // Move position and target
    camera->position = Vector3Add(camera->position, forward);
    camera->target = Vector3Add(camera->target, forward);
}